

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QDnsHostAddressRecordPrivate>::~QSharedDataPointer
          (QSharedDataPointer<QDnsHostAddressRecordPrivate> *this)

{
  QDnsHostAddressRecordPrivate *pQVar1;
  Data *pDVar2;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QDnsHostAddressRecordPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QDnsHostAddressRecordPrivate *)0x0) {
        QHostAddress::~QHostAddress(&pQVar1->value);
        pDVar2 = (pQVar1->super_QDnsRecordPrivate).name.d.d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
            QArrayData::deallocate
                      (&((pQVar1->super_QDnsRecordPrivate).name.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      operator_delete(pQVar1,0x30);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }